

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_tuple_data.cpp
# Opt level: O2

void duckdb::PartitionedTupleData::BuildPartitionSel<false>
               (PartitionedTupleDataAppendState *state,SelectionVector *append_sel,
               idx_t append_count)

{
  perfect_map_t<list_entry_t> *this;
  VectorType VVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  uint64_t uVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  __node_base *p_Var7;
  InternalException *this_00;
  _Hash_node_base *p_Var8;
  uint uVar9;
  idx_t iVar10;
  idx_t i_1;
  key_type *__k;
  idx_t iVar11;
  ulong uVar12;
  key_type *__k_00;
  allocator local_59;
  SelectionVector *local_58;
  string local_50;
  
  this = &state->partition_entries;
  __k_00 = (key_type *)(state->partition_indices).data;
  local_58 = append_sel;
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::list_entry_t>,_std::allocator<std::pair<const_unsigned_long,_duckdb::list_entry_t>_>,_std::__detail::_Select1st,_duckdb::PerfectEquality,_duckdb::PerfectHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&this->_M_h);
  VVar1 = (state->partition_indices).vector_type;
  if (VVar1 == CONSTANT_VECTOR) {
    pmVar6 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::list_entry_t>,_std::allocator<std::pair<const_unsigned_long,_duckdb::list_entry_t>_>,_std::__detail::_Select1st,_duckdb::PerfectEquality,_duckdb::PerfectHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::list_entry_t>,_std::allocator<std::pair<const_unsigned_long,_duckdb::list_entry_t>_>,_std::__detail::_Select1st,_duckdb::PerfectEquality,_duckdb::PerfectHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this,__k_00);
    pmVar6->offset = 0;
    pmVar6->length = append_count;
  }
  else {
    iVar11 = append_count;
    __k = __k_00;
    if (VVar1 != FLAT_VECTOR) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,"Unexpected VectorType in PartitionedTupleData::Append",
                 &local_59);
      InternalException::InternalException(this_00,&local_50);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    while (iVar11 != 0) {
      iVar5 = ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::list_entry_t>,_std::allocator<std::pair<const_unsigned_long,_duckdb::list_entry_t>_>,_std::__detail::_Select1st,_duckdb::PerfectEquality,_duckdb::PerfectHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&this->_M_h,__k);
      if (iVar5.
          super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::list_entry_t>,_true>.
          _M_cur == (__node_type *)0x0) {
        pmVar6 = ::std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::list_entry_t>,_std::allocator<std::pair<const_unsigned_long,_duckdb::list_entry_t>_>,_std::__detail::_Select1st,_duckdb::PerfectEquality,_duckdb::PerfectHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::list_entry_t>,_std::allocator<std::pair<const_unsigned_long,_duckdb::list_entry_t>_>,_std::__detail::_Select1st,_duckdb::PerfectEquality,_duckdb::PerfectHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this,__k);
        pmVar6->offset = 0;
        pmVar6->length = 1;
      }
      else {
        *(long *)((long)iVar5.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::list_entry_t>,_true>
                        ._M_cur + 0x18) =
             *(long *)((long)iVar5.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::list_entry_t>,_true>
                             ._M_cur + 0x18) + 1;
      }
      iVar11 = iVar11 - 1;
      __k = __k + 1;
    }
  }
  if ((state->partition_entries)._M_h._M_element_count == 1) {
    psVar2 = local_58->sel_vector;
    psVar3 = (state->reverse_partition_sel).sel_vector;
    for (uVar9 = 0; uVar12 = (ulong)uVar9, uVar12 < append_count; uVar9 = uVar9 + 1) {
      if (psVar2 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar2[uVar12];
      }
      psVar3[uVar12] = uVar9;
    }
  }
  else {
    p_Var7 = &(state->partition_entries)._M_h._M_before_begin;
    p_Var8 = (_Hash_node_base *)0x0;
    while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
      *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor = p_Var8;
      p_Var8 = (_Hash_node_base *)((long)&(p_Var7[3]._M_nxt)->_M_nxt + (long)&p_Var8->_M_nxt);
    }
    for (iVar11 = 0; append_count != iVar11; iVar11 = iVar11 + 1) {
      iVar10 = iVar11;
      if (local_58->sel_vector != (sel_t *)0x0) {
        iVar10 = (idx_t)local_58->sel_vector[iVar11];
      }
      pmVar6 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::list_entry_t>,_std::allocator<std::pair<const_unsigned_long,_duckdb::list_entry_t>_>,_std::__detail::_Select1st,_duckdb::PerfectEquality,_duckdb::PerfectHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::list_entry_t>,_std::allocator<std::pair<const_unsigned_long,_duckdb::list_entry_t>_>,_std::__detail::_Select1st,_duckdb::PerfectEquality,_duckdb::PerfectHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this,__k_00);
      uVar4 = pmVar6->offset;
      (state->reverse_partition_sel).sel_vector[iVar10] = (sel_t)uVar4;
      pmVar6->offset = uVar4 + 1;
      (state->partition_sel).sel_vector[uVar4] = (sel_t)iVar10;
      __k_00 = __k_00 + 1;
    }
  }
  return;
}

Assistant:

void PartitionedTupleData::BuildPartitionSel(PartitionedTupleDataAppendState &state, const SelectionVector &append_sel,
                                             const idx_t append_count) {
	using GETTER = TemplatedMapGetter<list_entry_t, fixed>;
	auto &partition_entries = state.GetMap<fixed>();
	const auto partition_indices = FlatVector::GetData<idx_t>(state.partition_indices);
	partition_entries.clear();
	switch (state.partition_indices.GetVectorType()) {
	case VectorType::FLAT_VECTOR:
		for (idx_t i = 0; i < append_count; i++) {
			const auto &partition_index = partition_indices[i];
			auto partition_entry = partition_entries.find(partition_index);
			if (partition_entry == partition_entries.end()) {
				partition_entries[partition_index] = list_entry_t(0, 1);
			} else {
				GETTER::GetValue(partition_entry).length++;
			}
		}
		break;
	case VectorType::CONSTANT_VECTOR:
		partition_entries[partition_indices[0]] = list_entry_t(0, append_count);
		break;
	default:
		throw InternalException("Unexpected VectorType in PartitionedTupleData::Append");
	}

	// Early out: check if everything belongs to a single partition
	if (partition_entries.size() == 1) {
		// This needs to be initialized, even if we go the short path here
		for (sel_t i = 0; i < append_count; i++) {
			const auto index = append_sel.get_index(i);
			state.reverse_partition_sel[index] = i;
		}
		return;
	}

	// Compute offsets from the counts
	idx_t offset = 0;
	for (auto it = partition_entries.begin(); it != partition_entries.end(); ++it) {
		auto &partition_entry = GETTER::GetValue(it);
		partition_entry.offset = offset;
		offset += partition_entry.length;
	}

	// Now initialize a single selection vector that acts as a selection vector for every partition
	auto &partition_sel = state.partition_sel;
	auto &reverse_partition_sel = state.reverse_partition_sel;
	for (idx_t i = 0; i < append_count; i++) {
		const auto index = append_sel.get_index(i);
		const auto &partition_index = partition_indices[i];
		auto &partition_offset = partition_entries[partition_index].offset;
		reverse_partition_sel[index] = UnsafeNumericCast<sel_t>(partition_offset);
		partition_sel[partition_offset++] = UnsafeNumericCast<sel_t>(index);
	}
}